

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

iterator __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::DescriptorTable_const*>,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,std::allocator<google::protobuf::internal::DescriptorTable_const*>>
::find_soo<std::basic_string_view<char,std::char_traits<char>>>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::DescriptorTable_const*>,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,std::allocator<google::protobuf::internal::DescriptorTable_const*>>
           *this,key_arg<std::basic_string_view<char>_> *key)

{
  bool bVar1;
  slot_type *slot;
  DescriptorTable **ts;
  iterator iVar2;
  EqualElement<std::basic_string_view<char,_std::char_traits<char>_>_> local_38;
  key_arg<std::basic_string_view<char>_> *local_28;
  key_arg<std::basic_string_view<char>_> *key_local;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
  *this_local;
  
  local_28 = key;
  key_local = (key_arg<std::basic_string_view<char>_> *)this;
  bVar1 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
          ::is_soo((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                    *)this);
  if (!bVar1) {
    __assert_fail("(is_soo()) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe21,
                  "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::internal::DescriptorTable *>, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameHash, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameEq, std::allocator<const google::protobuf::internal::DescriptorTable *>>::find_soo(const key_arg<K> &) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::internal::DescriptorTable *>, Hash = google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameHash, Eq = google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameEq, Alloc = std::allocator<const google::protobuf::internal::DescriptorTable *>, K = std::basic_string_view<char>]"
                 );
  }
  bVar1 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
          ::empty((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                   *)this);
  if (!bVar1) {
    local_38.rhs = local_28;
    local_38.eq = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                  ::eq_ref((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                            *)this);
    slot = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
           ::soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                       *)this);
    ts = common_policy_traits<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::DescriptorTable_const*>,void>
         ::
         element<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::DescriptorTable_const*>>
                   (slot);
    bVar1 = hash_policy_traits<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::DescriptorTable_const*>,void>
            ::
            apply<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::DescriptorTable_const*>,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,std::allocator<google::protobuf::internal::DescriptorTable_const*>>::EqualElement<std::basic_string_view<char,std::char_traits<char>>>,google::protobuf::internal::DescriptorTable_const*&,absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::DescriptorTable_const*>>
                      (&local_38,ts);
    if (bVar1) {
      iVar2 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
              ::soo_iterator((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                              *)this);
      return iVar2;
    }
  }
  iVar2 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
          ::end((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                 *)this);
  return iVar2;
}

Assistant:

iterator find_soo(const key_arg<K>& key) {
    ABSL_SWISSTABLE_ASSERT(is_soo());
    return empty() || !PolicyTraits::apply(EqualElement<K>{key, eq_ref()},
                                           PolicyTraits::element(soo_slot()))
               ? end()
               : soo_iterator();
  }